

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O0

void __thiscall OpenMD::Morse::calcForce(Morse *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  MorseType MVar4;
  reference pvVar5;
  reference this_00;
  reference pvVar6;
  double *pdVar7;
  int *in_RSI;
  long in_RDI;
  double dVar8;
  Vector<double,_3U> *pVVar9;
  RealType dudr;
  RealType pot_temp;
  RealType expfnc2C;
  RealType expfncC;
  RealType exptC;
  RealType expfnc2;
  RealType expfnc;
  RealType expt;
  MorseType variant;
  RealType beta;
  RealType Re;
  RealType De;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  MorseInteractionData *mixer;
  Vector<double,_3U> *in_stack_fffffffffffffef8;
  Vector<double,_3U> *in_stack_ffffffffffffff00;
  Vector<double,_3U> *v1;
  double local_88;
  double local_80;
  double local_28;
  double local_20;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize((Morse *)myDerivC);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)*in_RSI);
  this_00 = std::
            vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
                          *)(in_RDI + 0x58),(long)*pvVar5);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)in_RSI[1]);
  pvVar6 = std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>
           ::operator[](this_00,(long)*pvVar5);
  local_20 = 0.0;
  local_28 = 0.0;
  dVar1 = pvVar6->De;
  dVar2 = pvVar6->Re;
  dVar3 = pvVar6->beta;
  MVar4 = pvVar6->variant;
  dVar8 = exp(-dVar3 * (*(double *)(in_RSI + 8) - dVar2));
  local_80 = 0.0;
  local_88 = 0.0;
  if (((*(byte *)(in_RSI + 0xe) & 1) != 0) || ((*(byte *)((long)in_RSI + 0x39) & 1) != 0)) {
    local_80 = exp(-dVar3 * (*(double *)(in_RSI + 0xc) - dVar2));
    local_88 = local_80 * local_80;
  }
  if (MVar4 == mtShifted) {
    local_20 = dVar1 * (dVar8 * dVar8 - (dVar8 + dVar8));
    if ((*(byte *)(in_RSI + 0xe) & 1) == 0) {
      if ((*(byte *)((long)in_RSI + 0x39) & 1) == 0) {
        local_28 = 0.0;
      }
      else {
        local_28 = dVar1 * 2.0 * dVar3 * (local_80 - local_88) *
                   (*(double *)(in_RSI + 8) - *(double *)(in_RSI + 0xc)) +
                   dVar1 * (local_88 - (local_80 + local_80));
      }
    }
    else {
      local_28 = dVar1 * (local_88 - (local_80 + local_80));
    }
  }
  else if (MVar4 == mtRepulsive) {
    local_20 = dVar1 * dVar8 * dVar8;
    if ((*(byte *)(in_RSI + 0xe) & 1) == 0) {
      if ((*(byte *)((long)in_RSI + 0x39) & 1) == 0) {
        local_28 = 0.0;
      }
      else {
        local_28 = dVar1 * -2.0 * dVar3 * local_88 *
                   (*(double *)(in_RSI + 8) - *(double *)(in_RSI + 0xc)) + dVar1 * local_88;
      }
    }
    else {
      local_28 = dVar1 * local_88;
    }
  }
  pVVar9 = (Vector<double,_3U> *)(*(double *)(in_RSI + 0x14) * (local_20 - local_28));
  *(double *)(in_RSI + 0x34) = (double)pVVar9 + *(double *)(in_RSI + 0x34);
  v1 = *(Vector<double,_3U> **)(in_RSI + 0x10);
  pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),1);
  *pdVar7 = (double)v1 * (double)pVVar9 + *pdVar7;
  if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
    in_stack_fffffffffffffef8 = *(Vector<double,_3U> **)(in_RSI + 0x10);
    pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),1);
    *pdVar7 = (double)in_stack_fffffffffffffef8 * (double)pVVar9 + *pdVar7;
    in_stack_ffffffffffffff00 = pVVar9;
  }
  OpenMD::operator*(v1,(double)in_stack_ffffffffffffff00);
  operator/(v1,(double)in_stack_ffffffffffffff00);
  Vector<double,_3U>::operator+=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  return;
}

Assistant:

void Morse::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MorseInteractionData& mixer =
        MixingMap[Mtids[idat.atid1]][Mtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType De       = mixer.De;
    RealType Re       = mixer.Re;
    RealType beta     = mixer.beta;
    MorseType variant = mixer.variant;

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - Re);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - Re);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    switch (variant) {
    case mtShifted: {
      myPot   = De * (expfnc2 - 2.0 * expfnc);
      myDeriv = 2.0 * De * beta * (expfnc - expfnc2);

      if (idat.shiftedPot) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * (expfnc2C - 2.0 * expfncC);
        myDerivC = 2.0 * De * beta * (expfncC - expfnc2C);
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtRepulsive: {
      myPot   = De * expfnc2;
      myDeriv = -2.0 * De * beta * expfnc2;

      if (idat.shiftedPot) {
        myPotC   = De * expfnc2C;
        myDerivC = 0.0;
      } else if (idat.shiftedForce) {
        myPotC   = De * expfnc2C;
        myDerivC = -2.0 * De * beta * expfnc2C;
        myPotC += myDerivC * (idat.rij - idat.rcut);
      } else {
        myPotC   = 0.0;
        myDerivC = 0.0;
      }

      break;
    }
    case mtUnknown: {
      // don't know what to do so don't do anything
      break;
    }
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }